

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chop.cpp
# Opt level: O1

handle_t handlegraph::algorithms::combine_handles
                   (MutablePathDeletableHandleGraph *graph,
                   vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *handles)

{
  pointer phVar1;
  long lVar2;
  handle_t *phVar3;
  bool bVar4;
  handle_t hVar5;
  handle_t *phVar6;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> *__range2;
  long lVar7;
  handle_t *handle;
  pointer phVar8;
  handle_t *phVar9;
  handle_t combined;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_rev;
  vector<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_> edges_fwd_fwd;
  string seq;
  handle_t local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  handle_t local_a0;
  handle_t *local_98;
  handle_t *phStack_90;
  long local_88;
  handle_t *local_78;
  handle_t *phStack_70;
  long local_68;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  handle_t **local_38;
  
  local_58 = &local_48;
  local_50 = 0;
  local_48 = 0;
  phVar8 = (handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_start;
  phVar1 = (handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (phVar8 != phVar1) {
    do {
      (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x40))
                (&local_c8,&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),phVar8);
      std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_c8.data);
      if (local_c8.data != (char  [8])&local_b8) {
        operator_delete((void *)local_c8.data,(long)local_b8 + 1);
      }
      phVar8 = phVar8 + 1;
    } while (phVar8 != phVar1);
  }
  local_a0.data =
       (char  [8])
       (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0)) + 0xa0))
                 (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1d0),&local_58);
  local_38 = &local_78;
  local_68 = 0;
  local_78 = (handle_t *)0x0;
  phStack_70 = (handle_t *)0x0;
  local_88 = 0;
  local_98 = (handle_t *)0x0;
  phStack_90 = (handle_t *)0x0;
  uStack_c0 = 0;
  pcStack_b0 = std::
               _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_c8.data = (char  [8])&local_38;
  (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
            (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
             (handles->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_finish + -1,0);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  local_38 = &local_98;
  uStack_c0 = 0;
  pcStack_b0 = std::
               _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<bool_(const_handlegraph::handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/include/handlegraph/iteratee.hpp:85:16)>
             ::_M_manager;
  local_c8.data = (char  [8])&local_38;
  (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x90))
            (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
             (handles->
             super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
             _M_impl.super__Vector_impl_data._M_start,1);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  phVar1 = (handles->
           super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (phVar8 = (handles->
                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>).
                _M_impl.super__Vector_impl_data._M_start; phVar3 = phStack_70, phVar8 != phVar1;
      phVar8 = phVar8 + 1) {
    (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0)) + 0xf8))
              (&graph->field_0x0 + *(long *)(*(long *)graph + -0x1e0),phVar8);
  }
  if (local_78 != phStack_70) {
    phVar9 = local_78;
    do {
      bVar4 = operator==(phVar9,(handles->
                                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                                )._M_impl.super__Vector_impl_data._M_start);
      if (bVar4) {
        lVar7 = *(long *)(*(long *)graph + -0x1d0);
        phVar6 = &local_a0;
LAB_00160a5c:
        (**(code **)(*(long *)(&graph->field_0x0 + lVar7) + 0xb0))
                  (&graph->field_0x0 + lVar7,&local_a0,phVar6);
      }
      else {
        local_c8.data =
             (char  [8])
             (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x30))
                       (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
                        (handles->
                        super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                        )._M_impl.super__Vector_impl_data._M_finish + -1);
        bVar4 = operator==(phVar9,&local_c8);
        lVar7 = *(long *)(*(long *)graph + -0x1d0);
        phVar6 = phVar9;
        if (!bVar4) goto LAB_00160a5c;
        lVar2 = *(long *)(*(long *)graph + -0xb0);
        local_c8.data =
             (char  [8])
             (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0x30))
                       (&graph->field_0x0 + lVar2,&local_a0);
        (**(code **)(*(long *)(&graph->field_0x0 + lVar7) + 0xb0))
                  (&graph->field_0x0 + lVar7,&local_a0,&local_c8);
      }
      phVar9 = phVar9 + 1;
    } while (phVar9 != phVar3);
  }
  phVar3 = phStack_90;
  if (local_98 != phStack_90) {
    phVar9 = local_98;
    do {
      bVar4 = operator==(phVar9,(handles->
                                super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                                )._M_impl.super__Vector_impl_data._M_finish + -1);
      if (bVar4) {
        lVar7 = *(long *)(*(long *)graph + -0x1d0);
        phVar6 = &local_a0;
LAB_00160b1c:
        (**(code **)(*(long *)(&graph->field_0x0 + lVar7) + 0xb0))
                  (&graph->field_0x0 + lVar7,phVar6,&local_a0);
      }
      else {
        local_c8.data =
             (char  [8])
             (**(code **)(*(long *)(&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0)) + 0x30))
                       (&graph->field_0x0 + *(long *)(*(long *)graph + -0xb0),
                        (handles->
                        super__Vector_base<handlegraph::handle_t,_std::allocator<handlegraph::handle_t>_>
                        )._M_impl.super__Vector_impl_data._M_start);
        bVar4 = operator==(phVar9,&local_c8);
        lVar7 = *(long *)(*(long *)graph + -0x1d0);
        phVar6 = phVar9;
        if (!bVar4) goto LAB_00160b1c;
        lVar2 = *(long *)(*(long *)graph + -0xb0);
        local_c8.data =
             (char  [8])
             (**(code **)(*(long *)(&graph->field_0x0 + lVar2) + 0x30))
                       (&graph->field_0x0 + lVar2,&local_a0);
        (**(code **)(*(long *)(&graph->field_0x0 + lVar7) + 0xb0))
                  (&graph->field_0x0 + lVar7,&local_c8,&local_a0);
      }
      phVar9 = phVar9 + 1;
    } while (phVar9 != phVar3);
  }
  if (local_98 != (handle_t *)0x0) {
    operator_delete(local_98,local_88 - (long)local_98);
  }
  if (local_78 != (handle_t *)0x0) {
    operator_delete(local_78,local_68 - (long)local_78);
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  hVar5.data[0] = local_a0.data[0];
  hVar5.data[1] = local_a0.data[1];
  hVar5.data[2] = local_a0.data[2];
  hVar5.data[3] = local_a0.data[3];
  hVar5.data[4] = local_a0.data[4];
  hVar5.data[5] = local_a0.data[5];
  hVar5.data[6] = local_a0.data[6];
  hVar5.data[7] = local_a0.data[7];
  return (handle_t)hVar5.data;
}

Assistant:

handle_t combine_handles(MutablePathDeletableHandleGraph& graph,
                         const std::vector<handle_t>& handles) {
    std::string seq;
    for (auto& handle : handles) {
        seq.append(graph.get_sequence(handle));
    }
    handle_t combined = graph.create_handle(seq);
    // relink the inbound and outbound nodes
    // get the edge context
    std::vector<handle_t> edges_fwd_fwd;
    std::vector<handle_t> edges_fwd_rev;
    std::vector<handle_t> edges_rev_fwd;
    std::vector<handle_t> edges_rev_rev;
    graph.follow_edges(
                       handles.back(), false,
                       [&](const handle_t& h) {
        edges_fwd_fwd.push_back(h);
    });
    graph.follow_edges(
                       handles.front(), true,
                       [&](const handle_t& h) {
        edges_fwd_rev.push_back(h);
    });
    // destroy the old handles
    for (auto& handle : handles) {
        graph.destroy_handle(handle);
    }
    // connect the ends to the previous context
    // check that we're not trying to make edges that connect back with the nodes in the component
    // there are three cases
    // self looping, front and rear inverting
    for (auto& h : edges_fwd_fwd) {
        if (h == handles.front()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.back())) {
            graph.create_edge(combined, graph.flip(combined));
        } else {
            graph.create_edge(combined, h);
        }
    }
    for (auto& h : edges_fwd_rev) {
        if (h == handles.back()) {
            graph.create_edge(combined, combined);
        } else if (h == graph.flip(handles.front())) {
            graph.create_edge(graph.flip(combined), combined);
        } else {
            graph.create_edge(h, combined);
        }
    }
    return combined;
}